

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O3

void tls_thread(void *arg)

{
  void **ppvVar1;
  int iVar2;
  void *pvVar3;
  pthread_t __th;
  ulong uVar4;
  long lVar5;
  addrinfo *ai;
  uv_key_t *puVar6;
  int iVar7;
  code **ppcVar8;
  code **ppcVar9;
  uv_thread_t *puVar10;
  uv_thread_t *puVar11;
  uv_thread_t *puVar12;
  uv_thread_t *puVar13;
  uv_thread_t *puVar14;
  uv_thread_t *puVar15;
  uv_thread_t *puVar16;
  uv_thread_t *puVar17;
  uv_thread_t *puVar18;
  uv_thread_t *puVar19;
  uv_thread_t *puVar20;
  uv_thread_t *puVar21;
  uv_loop_t *loop;
  uv_loop_t *loop_00;
  uv_thread_t uStack_90;
  uv_thread_options_t uStack_88;
  rlimit64 rStack_78;
  ulong uStack_68;
  pthread_attr_t pStack_60;
  code *pcStack_28;
  code *apcStack_20 [2];
  uv_fs_t *req;
  
  apcStack_20[0] = (code *)0x172f6a;
  pvVar3 = uv_key_get(&tls_key);
  if (pvVar3 == (void *)0x0) {
    apcStack_20[0] = (code *)0x172f81;
    uv_key_set(&tls_key,arg);
    apcStack_20[0] = (code *)0x172f89;
    pvVar3 = uv_key_get(&tls_key);
    if (pvVar3 != arg) goto LAB_00172fb9;
    puVar6 = &tls_key;
    apcStack_20[0] = (code *)0x172f9f;
    uv_key_set(&tls_key,(void *)0x0);
    apcStack_20[0] = (code *)0x172fa7;
    pvVar3 = uv_key_get(&tls_key);
    if (pvVar3 == (void *)0x0) {
      return;
    }
  }
  else {
    apcStack_20[0] = (code *)0x172fb9;
    tls_thread_cold_1();
LAB_00172fb9:
    apcStack_20[0] = (code *)0x172fbe;
    tls_thread_cold_2();
    puVar6 = (uv_key_t *)arg;
  }
  apcStack_20[0] = run_test_thread_stack_size;
  tls_thread_cold_3();
  ppcVar8 = apcStack_20;
  ppcVar9 = apcStack_20;
  pcStack_28 = (code *)0x172fd5;
  iVar2 = uv_thread_create((uv_thread_t *)apcStack_20,thread_check_stack,(void *)0x0);
  if (iVar2 == 0) {
    pcStack_28 = (code *)0x172fe1;
    iVar2 = uv_thread_join((uv_thread_t *)apcStack_20);
    ppcVar8 = ppcVar9;
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_28 = (code *)0x172fee;
    run_test_thread_stack_size_cold_1();
  }
  pcStack_28 = thread_check_stack;
  run_test_thread_stack_size_cold_2();
  uStack_88.stack_size = 0x173008;
  pcStack_28 = (code *)puVar6;
  iVar2 = getrlimit64(RLIMIT_STACK,&rStack_78);
  if (iVar2 == 0) {
    if (rStack_78.rlim_cur == 0xffffffffffffffff) {
      rStack_78.rlim_cur = 0x200000;
    }
    uStack_88.stack_size = 0x173020;
    __th = pthread_self();
    uStack_88.stack_size = 0x17302d;
    iVar2 = pthread_getattr_np(__th,&pStack_60);
    if (iVar2 != 0) goto LAB_00173076;
    uStack_88.stack_size = 0x173040;
    iVar2 = pthread_attr_getstacksize(&pStack_60,&uStack_68);
    if (iVar2 != 0) goto LAB_0017307b;
    if ((ppcVar8 == (code **)0x0) ||
       (uVar4 = *(ulong *)((long)ppcVar8 + 8), *(ulong *)((long)ppcVar8 + 8) == 0)) {
      uVar4 = rStack_78.rlim_cur;
    }
    if (uStack_68 < uVar4) goto LAB_00173080;
    uStack_88.stack_size = 0x173067;
    iVar2 = pthread_attr_destroy(&pStack_60);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    uStack_88.stack_size = 0x173076;
    thread_check_stack_cold_1();
LAB_00173076:
    uStack_88.stack_size = 0x17307b;
    thread_check_stack_cold_2();
LAB_0017307b:
    uStack_88.stack_size = 0x173080;
    thread_check_stack_cold_3();
LAB_00173080:
    uStack_88.stack_size = 0x173085;
    thread_check_stack_cold_5();
  }
  uStack_88.stack_size = (size_t)run_test_thread_stack_size_explicit;
  thread_check_stack_cold_4();
  puVar10 = &uStack_90;
  puVar11 = &uStack_90;
  puVar12 = &uStack_90;
  puVar17 = &uStack_90;
  puVar13 = &uStack_90;
  puVar18 = &uStack_90;
  puVar14 = &uStack_90;
  puVar19 = &uStack_90;
  puVar15 = &uStack_90;
  puVar20 = &uStack_90;
  puVar16 = &uStack_90;
  puVar21 = &uStack_90;
  uStack_88.flags = 1;
  uStack_88.stack_size = 0x100000;
  iVar2 = uv_thread_create_ex(&uStack_90,&uStack_88,thread_check_stack,&uStack_88);
  if (iVar2 == 0) {
    iVar2 = uv_thread_join(&uStack_90);
    puVar10 = puVar11;
    if (iVar2 != 0) goto LAB_001731fb;
    uStack_88.stack_size = 0x800000;
    iVar2 = uv_thread_create_ex(&uStack_90,&uStack_88,thread_check_stack,&uStack_88);
    puVar10 = puVar12;
    if (iVar2 != 0) goto LAB_00173200;
    iVar2 = uv_thread_join(&uStack_90);
    if (iVar2 != 0) goto LAB_00173205;
    uStack_88.stack_size = 0;
    iVar2 = uv_thread_create_ex(&uStack_90,&uStack_88,thread_check_stack,&uStack_88);
    puVar17 = puVar13;
    if (iVar2 != 0) goto LAB_0017320a;
    iVar2 = uv_thread_join(&uStack_90);
    if (iVar2 != 0) goto LAB_0017320f;
    lVar5 = __sysconf(0x4b);
    uStack_88.stack_size = lVar5 - 0x2a;
    iVar2 = uv_thread_create_ex(&uStack_90,&uStack_88,thread_check_stack,&uStack_88);
    puVar18 = puVar14;
    if (iVar2 != 0) goto LAB_00173214;
    iVar2 = uv_thread_join(&uStack_90);
    if (iVar2 != 0) goto LAB_00173219;
    lVar5 = __sysconf(0x4b);
    uStack_88.stack_size = lVar5 / 2 - 0x2a;
    iVar2 = uv_thread_create_ex(&uStack_90,&uStack_88,thread_check_stack,&uStack_88);
    puVar19 = puVar15;
    if (iVar2 != 0) goto LAB_0017321e;
    iVar2 = uv_thread_join(&uStack_90);
    if (iVar2 != 0) goto LAB_00173223;
    uStack_88.stack_size = 0x12d687;
    iVar2 = uv_thread_create_ex(&uStack_90,&uStack_88,thread_check_stack,&uStack_88);
    puVar20 = puVar16;
    if (iVar2 == 0) {
      iVar2 = uv_thread_join(&uStack_90);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_0017322d;
    }
  }
  else {
    run_test_thread_stack_size_explicit_cold_1();
LAB_001731fb:
    run_test_thread_stack_size_explicit_cold_2();
LAB_00173200:
    puVar17 = puVar10;
    run_test_thread_stack_size_explicit_cold_3();
LAB_00173205:
    run_test_thread_stack_size_explicit_cold_4();
LAB_0017320a:
    puVar18 = puVar17;
    run_test_thread_stack_size_explicit_cold_5();
LAB_0017320f:
    run_test_thread_stack_size_explicit_cold_6();
LAB_00173214:
    puVar19 = puVar18;
    run_test_thread_stack_size_explicit_cold_7();
LAB_00173219:
    run_test_thread_stack_size_explicit_cold_8();
LAB_0017321e:
    puVar20 = puVar19;
    run_test_thread_stack_size_explicit_cold_9();
LAB_00173223:
    run_test_thread_stack_size_explicit_cold_10();
  }
  puVar21 = puVar20;
  run_test_thread_stack_size_explicit_cold_11();
LAB_0017322d:
  run_test_thread_stack_size_explicit_cold_12();
  loop = *(uv_loop_t **)((long)puVar21 + 0x10);
  iVar2 = uv_getaddrinfo(loop,(uv_getaddrinfo_t *)((long)puVar21 + 0x18),getaddrinfo_cb,"localhost",
                         (char *)0x0,(addrinfo *)0x0);
  if (iVar2 == 0) {
    return;
  }
  getaddrinfo_do_cold_1();
  loop_00 = (uv_loop_t *)loop->handle_queue[0];
  req = (uv_fs_t *)(loop->handle_queue + 1);
  iVar2 = uv_fs_stat(loop_00,req,".",fs_cb);
  iVar7 = (int)req;
  if (iVar2 == 0) {
    return;
  }
  fs_do_cold_1();
  if (iVar7 != 0) {
    getaddrinfo_cb_cold_1();
    uv_fs_req_cleanup((uv_fs_t *)loop_00);
    ppvVar1 = &loop_00[-1].inotify_watchers;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 != 0) {
      fs_do((fs_req *)&loop_00[-1].inotify_read_watcher.fd);
      return;
    }
    return;
  }
  uv_freeaddrinfo(ai);
  ppvVar1 = &loop_00[-1].inotify_watchers;
  *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
  if (*(int *)ppvVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)&loop_00[-1].inotify_read_watcher.fd);
    return;
  }
  return;
}

Assistant:

static void tls_thread(void* arg) {
  ASSERT(NULL == uv_key_get(&tls_key));
  uv_key_set(&tls_key, arg);
  ASSERT(arg == uv_key_get(&tls_key));
  uv_key_set(&tls_key, NULL);
  ASSERT(NULL == uv_key_get(&tls_key));
}